

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_mp_print(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  char *data;
  char *__s2;
  char *buf;
  char cVar4;
  char *__format;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  char local_1b8 [76];
  undefined1 local_16c;
  undefined1 local_16b;
  undefined2 uStack_16a;
  undefined1 local_168;
  undefined2 uStack_167;
  undefined8 uStack_165;
  undefined6 uStack_15d;
  undefined2 uStack_157;
  undefined6 uStack_155;
  undefined1 uStack_14f;
  char result [256];
  
  _plan(0xc,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_print");
  local_1b8[0] = -0x68;
  local_1b8[1] = -5;
  local_1b8[2] = '*';
  local_1b8[3] = -0x57;
  local_1b8[4] = 'k';
  local_1b8[5] = 'i';
  local_1b8[6] = 'l';
  local_1b8[7] = 'l';
  local_1b8[8] = '/';
  local_1b8[9] = 'b';
  local_1b8[10] = 'i';
  local_1b8[0xb] = 'l';
  local_1b8[0xc] = 0x6c;
  local_1b8[0xd] = -0x70;
  local_1b8[0xe] = -0x7a;
  local_1b8[0xf] = 0xa9;
  local_1b8[0x10] = 'b';
  local_1b8[0x11] = 'o';
  local_1b8[0x12] = 'o';
  local_1b8[0x13] = 'l';
  local_1b8[0x14] = ' ';
  local_1b8[0x15] = 't';
  local_1b8[0x16] = 'r';
  local_1b8[0x17] = 'u';
  local_1b8[0x18] = 0x65;
  local_1b8[0x19] = -0x3d;
  local_1b8[0x1a] = -0x56;
  local_1b8[0x1b] = 'b';
  local_1b8[0x1c] = 'o';
  local_1b8[0x1d] = 'o';
  local_1b8[0x1e] = 'l';
  local_1b8[0x1f] = ' ';
  local_1b8[0x20] = 'f';
  local_1b8[0x21] = 'a';
  local_1b8[0x22] = 'l';
  local_1b8[0x23] = 's';
  local_1b8[0x24] = 'e';
  local_1b8[0x25] = -0x3e;
  local_1b8[0x26] = -0x5c;
  local_1b8[0x27] = 'n';
  local_1b8[0x28] = 'u';
  local_1b8[0x29] = 'l';
  local_1b8[0x2a] = 'l';
  local_1b8[0x2b] = -0x40;
  local_1b8[0x2c] = -0x5b;
  local_1b8[0x2d] = 'f';
  local_1b8[0x2e] = 'l';
  local_1b8[0x2f] = 'o';
  local_1b8[0x30] = 'a';
  local_1b8[0x31] = 't';
  local_1b8[0x32] = -0x36;
  local_1b8[0x33] = '@';
  local_1b8[0x34] = 'H';
  local_1b8[0x35] = -0xb;
  local_1b8[0x36] = -0x3d;
  local_1b8[0x37] = 0xa6;
  local_1b8[0x38] = 'd';
  local_1b8[0x39] = 'o';
  local_1b8[0x3a] = 'u';
  local_1b8[0x3b] = 'b';
  local_1b8[0x3c] = 'l';
  local_1b8[0x3d] = 'e';
  local_1b8[0x3e] = 0xcb;
  local_1b8[0x3f] = '@';
  local_1b8[0x40] = '\t';
  local_1b8[0x41] = '\x1e';
  local_1b8[0x42] = -0x48;
  local_1b8[0x43] = 'Q';
  local_1b8[0x44] = -0x15;
  local_1b8[0x45] = -0x7b;
  local_1b8[0x46] = '\x1f';
  local_1b8[0x47] = 'd';
  local_1b8[0x48] = -0x33;
  local_1b8[0x49] = '\x01';
  local_1b8[0x4a] = -0xc;
  local_16c = 3;
  local_1b8[0x4b] = 199;
  local_16b = 0x7b;
  uStack_16a = 0x7473;
  local_168 = 0x72;
  uStack_167 = 0x16c4;
  uStack_165 = 0x908347473657412;
  uStack_15d = 0x5c616c62220a;
  uStack_157 = 0x622d;
  uStack_155 = 0xd0c22616c;
  uStack_14f = 0x80;
  iVar1 = mp_snprint(result,0x100,local_1b8);
  uVar5 = 0;
  _ok((uint)(iVar1 == 200),"fsize == esize",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4b8,
      "mp_snprint return value");
  iVar1 = bcmp(result,
               "[-5, 42, \"kill/bill\", [], {\"bool true\": true, \"bool false\": false, \"null\": null, \"float\": 3.14, \"double\": 3.14, 100: 500}, (extension: type 123, len 3), \"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]"
               ,0xc9);
  _ok((uint)(iVar1 == 0),"strcmp(result, expected) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4b9,
      "mp_snprint result");
  iVar1 = mp_snprint((char *)0x0,0,local_1b8);
  _ok((uint)(iVar1 == 200),"fsize == esize",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4bc,
      "mp_snprint limit = 0");
  iVar1 = mp_snprint(result,1,local_1b8);
  _ok((uint)(result[0] == '\0' && iVar1 == 200),"fsize == esize && result[0] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4bf,
      "mp_snprint limit = 1");
  iVar1 = mp_snprint(result,2,local_1b8);
  _ok((uint)(result[1] == '\0' && iVar1 == 200),"fsize == esize && result[1] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4c2,
      "mp_snprint limit = 2");
  iVar1 = mp_snprint(result,200,local_1b8);
  _ok((uint)(result[199] == '\0' && iVar1 == 200),"fsize == esize && result[esize - 1] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4c6,
      "mp_snprint limit = expected");
  iVar1 = mp_snprint(result,0xc9,local_1b8);
  _ok((uint)(result[200] == '\0' && iVar1 == 200),"fsize == esize && result[esize] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4ca,
      "mp_snprint limit = expected + 1");
  __stream = tmpfile();
  if (__stream != (FILE *)0x0) {
    iVar1 = mp_fprint((FILE *)__stream,local_1b8);
    _ok((uint)(iVar1 == 200),"fsize == esize",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x4cf,"mp_fprint return value");
    rewind(__stream);
    sVar3 = fread(result,1,0x100,__stream);
    if ((int)sVar3 == 200) {
      iVar1 = bcmp(result,
                   "[-5, 42, \"kill/bill\", [], {\"bool true\": true, \"bool false\": false, \"null\": null, \"float\": 3.14, \"double\": 3.14, 100: 500}, (extension: type 123, len 3), \"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]"
                   ,200);
      uVar5 = (uint)(iVar1 == 0);
    }
    _ok(uVar5,"rsize == esize && memcmp(result, expected, esize) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x4d3,"mp_fprint result");
    fclose(__stream);
  }
  iVar1 = mp_fprint(_stdin,local_1b8);
  _ok((uint)(iVar1 == -1),"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4d9,
      "mp_fprint I/O error");
  data = (char *)malloc(0x22);
  __s2 = (char *)malloc(0x46);
  buf = (char *)malloc(0x46);
  lVar7 = 0;
  uVar5 = 0;
  pcVar6 = data;
  do {
    if (uVar5 == 0x43) {
      if (lVar7 != 0x45) {
        __assert_fail("exp_str_wptr + 1 == exp_str + exp_str_sz",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x4f2,"int test_mp_print()");
      }
      iVar1 = mp_snprint(buf,0x46,data);
      _ok((uint)(iVar1 == 0x45),"rc == exp_str_sz - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x4f4,"mp_snprint max nesting depth return value");
      iVar1 = strcmp(buf,__s2);
      _ok((uint)(iVar1 == 0),"strcmp(decoded, exp_str) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x4f5,"mp_snprint max nesting depth result");
      free(buf);
      free(__s2);
      free(data);
      _space(_stdout);
      printf("# *** %s: done ***\n","test_mp_print");
      iVar1 = check_plan();
      return iVar1;
    }
    uVar2 = 0x46 - (int)lVar7;
    if ((int)uVar2 < 1) {
      __assert_fail("exp_str_rest > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x4e6,"int test_mp_print()");
    }
    cVar4 = -0x6f;
    __format = "[";
    if (uVar5 < 0x21) {
LAB_001036eb:
      *pcVar6 = cVar4;
      pcVar6 = pcVar6 + 1;
    }
    else {
      cVar4 = '\x01';
      __format = "...";
      if (uVar5 == 0x21) goto LAB_001036eb;
      __format = "]";
    }
    iVar1 = snprintf(__s2 + lVar7,(ulong)uVar2,__format);
    lVar7 = lVar7 + iVar1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int
test_mp_print()
{
	plan(12);
	header();

	char msgpack[128];
	char *d = msgpack;
	d = mp_encode_array(d, 8);
	d = mp_encode_int(d, -5);
	d = mp_encode_uint(d, 42);
	d = mp_encode_str(d, "kill/bill", 9);
	d = mp_encode_array(d, 0);
	d = mp_encode_map(d, 6);
	d = mp_encode_str(d, "bool true", 9);
	d = mp_encode_bool(d, true);
	d = mp_encode_str(d, "bool false", 10);
	d = mp_encode_bool(d, false);
	d = mp_encode_str(d, "null", 4);
	d = mp_encode_nil(d);
	d = mp_encode_str(d, "float", 5);
	d = mp_encode_float(d, 3.14);
	d = mp_encode_str(d, "double", 6);
	d = mp_encode_double(d, 3.14);
	d = mp_encode_uint(d, 100);
	d = mp_encode_uint(d, 500);
	/* MP_EXT with type 123 and of size 3 bytes. */
	d = mp_encode_extl(d, 123, 3);
	memcpy(d, "str", 3);
	d += 3;
	char bin[] = "\x12test\x34\b\t\n\"bla\\-bla\"\f\r";
	d = mp_encode_bin(d, bin, sizeof(bin));
	d = mp_encode_map(d, 0);
	assert(d <= msgpack + sizeof(msgpack));

	const char *expected =
		"[-5, 42, \"kill/bill\", [], "
		"{\"bool true\": true, \"bool false\": false, \"null\": null, "
		"\"float\": 3.14, \"double\": 3.14, 100: 500}, "
		"(extension: type 123, len 3), "
		"\"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]";
	int esize = strlen(expected);

	char result[256];

	int fsize = mp_snprint(result, sizeof(result), msgpack);
	ok(fsize == esize, "mp_snprint return value");
	ok(strcmp(result, expected) == 0, "mp_snprint result");

	fsize = mp_snprint(NULL, 0, msgpack);
	ok(fsize == esize, "mp_snprint limit = 0");

	fsize = mp_snprint(result, 1, msgpack);
	ok(fsize == esize && result[0] == '\0', "mp_snprint limit = 1");

	fsize = mp_snprint(result, 2, msgpack);
	ok(fsize == esize && result[1] == '\0', "mp_snprint limit = 2");

	fsize = mp_snprint(result, esize, msgpack);
	ok(fsize == esize && result[esize - 1] == '\0',
	   "mp_snprint limit = expected");

	fsize = mp_snprint(result, esize + 1, msgpack);
	ok(fsize == esize && result[esize] == '\0',
	   "mp_snprint limit = expected + 1");

	FILE *tmpf = tmpfile();
	if (tmpf != NULL) {
		int fsize = mp_fprint(tmpf, msgpack);
		ok(fsize == esize, "mp_fprint return value");
		(void) rewind(tmpf);
		int rsize = fread(result, 1, sizeof(result), tmpf);
		ok(rsize == esize && memcmp(result, expected, esize) == 0,
		   "mp_fprint result");
		fclose(tmpf);
	}

	/* stdin is read-only */
	int rc = mp_fprint(stdin, msgpack);
	is(rc, -1, "mp_fprint I/O error");

	/* Test mp_snprint max nesting depth. */
	int mp_buff_sz = (MP_PRINT_MAX_DEPTH + 1) * mp_sizeof_array(1) +
			 mp_sizeof_uint(1);
	int exp_str_sz = 2 * (MP_PRINT_MAX_DEPTH + 1) + 3 + 1;
	char *mp_buff = (char *)malloc(mp_buff_sz);
	char *exp_str = (char *)malloc(exp_str_sz);
	char *decoded = (char *)malloc(exp_str_sz);
	char *buff_wptr = mp_buff;
	char *exp_str_wptr = exp_str;
	for (int i = 0; i <= 2 * (MP_PRINT_MAX_DEPTH + 1); i++) {
		int exp_str_rest = exp_str_sz - (exp_str_wptr - exp_str);
		assert(exp_str_rest > 0);
		if (i < MP_PRINT_MAX_DEPTH + 1) {
			buff_wptr = mp_encode_array(buff_wptr, 1);
			rc = snprintf(exp_str_wptr, exp_str_rest, "[");
		} else if (i == MP_PRINT_MAX_DEPTH + 1) {
			buff_wptr = mp_encode_uint(buff_wptr, 1);
			rc = snprintf(exp_str_wptr, exp_str_rest, "...");
		} else {
			rc = snprintf(exp_str_wptr, exp_str_rest, "]");
		}
		exp_str_wptr += rc;
	}
	assert(exp_str_wptr + 1 == exp_str + exp_str_sz);
	rc = mp_snprint(decoded, exp_str_sz, mp_buff);
	ok(rc == exp_str_sz - 1, "mp_snprint max nesting depth return value");
	ok(strcmp(decoded, exp_str) == 0, "mp_snprint max nesting depth result");
	free(decoded);
	free(exp_str);
	free(mp_buff);
	footer();
	return check_plan();
}